

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O1

bool ImNodes::RenderConnection(ImVec2 *input_pos,ImVec2 *output_pos,float thickness)

{
  int iVar1;
  ImVec2 *pIVar2;
  bool bVar3;
  float *pfVar4;
  ImU32 col;
  ImDrawList *this;
  ImVec2 *__dest;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 p3;
  ImVec2 p2;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  this = ImGui::GetWindowDrawList();
  pfVar4 = gCanvas;
  ImGui::GetStyle();
  fVar11 = *pfVar4;
  local_38.y = input_pos->y;
  local_38.x = input_pos->x - *pfVar4 * 100.0;
  local_40.x = *pfVar4 * 100.0 + output_pos->x;
  local_40.y = output_pos->y + 0.0;
  iVar7 = (this->_Path).Size;
  iVar1 = (this->_Path).Capacity;
  if (iVar7 == iVar1) {
    iVar7 = iVar7 + 1;
    if (iVar1 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar1 / 2 + iVar1;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar1 < iVar7) {
      __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
      pIVar2 = (this->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(__dest,pIVar2,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = __dest;
      (this->_Path).Capacity = iVar7;
    }
  }
  (this->_Path).Data[(this->_Path).Size] = *input_pos;
  (this->_Path).Size = (this->_Path).Size + 1;
  ImDrawList::PathBezierCurveTo(this,&local_38,&local_40,output_pos,0);
  if ((this->_Path).Size < 2) {
    fVar12 = 3.4028235e+38;
  }
  else {
    fVar12 = 3.4028235e+38;
    lVar9 = 0;
    lVar8 = 0;
    do {
      local_48 = ImGui::GetMousePos();
      lVar5 = (long)(this->_Path).Size;
      if ((lVar5 <= lVar8) || (lVar8 = lVar8 + 1, lVar5 <= lVar8)) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                      ,0x4d7,"T &ImVector<ImVec2>::operator[](int) [T = ImVec2]");
      }
      pIVar2 = (this->_Path).Data;
      fVar10 = GetDistanceToLineSquared
                         (&local_48,(ImVec2 *)((long)&pIVar2->x + lVar9),
                          (ImVec2 *)((long)&pIVar2[1].x + lVar9));
      if (fVar10 <= fVar12) {
        fVar12 = fVar10;
      }
      lVar9 = lVar9 + 8;
    } while (lVar8 < (long)(this->_Path).Size + -1);
  }
  fVar11 = fVar11 * thickness;
  bVar3 = fVar12 <= fVar11 * fVar11;
  col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)(pfVar4 + (ulong)bVar3 * 4 + 0x13));
  ImDrawList::AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,false,fVar11);
  (this->_Path).Size = 0;
  return bVar3;
}

Assistant:

bool RenderConnection(const ImVec2& input_pos, const ImVec2& output_pos, float thickness)
{
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    CanvasState* canvas = gCanvas;
    const ImGuiStyle& style = ImGui::GetStyle();

    thickness *= canvas->zoom;

    ImVec2 p2 = input_pos - ImVec2{100 * canvas->zoom, 0};
    ImVec2 p3 = output_pos + ImVec2{100 * canvas->zoom, 0};

    // Assemble segments for path
    draw_list->PathLineTo(input_pos);
    draw_list->PathBezierCurveTo(p2, p3, output_pos, 0);

    // Check each segment and determine if mouse is hovering curve that is to be drawn
    float min_square_distance = FLT_MAX;
    for (int i = 0; i < draw_list->_Path.size() - 1; i++)
    {
        min_square_distance = ImMin(min_square_distance,
            GetDistanceToLineSquared(ImGui::GetMousePos(), draw_list->_Path[i], draw_list->_Path[i + 1]));
    }

    // Draw curve, change when it is hovered
    bool is_close = min_square_distance <= thickness * thickness;
    draw_list->PathStroke(is_close ? canvas->colors[ColConnectionActive] : canvas->colors[ColConnection], false, thickness);
    return is_close;
}